

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::
HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
::Insert(HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
         *this,LightHandle *key,LightBVHNode **value)

{
  LightBVHNode *pLVar1;
  size_t sVar2;
  optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *poVar3;
  size_t sVar4;
  
  sVar2 = FindOffset(this,key);
  poVar3 = (this->table).ptr;
  if ((poVar3[sVar2].set == false) &&
     (sVar4 = this->nStored + 1, this->nStored = sVar4, (this->table).nStored < sVar4 * 3)) {
    Grow(this);
    sVar2 = FindOffset(this,key);
    poVar3 = (this->table).ptr;
  }
  pLVar1 = *value;
  poVar3[sVar2].optionalValue.__align =
       (anon_struct_8_0_00000001_for___align)
       (key->
       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
       ).bits;
  *(LightBVHNode **)((long)&poVar3[sVar2].optionalValue + 8) = pLVar1;
  poVar3[sVar2].set = true;
  return;
}

Assistant:

void Insert(const Key &key, const Value &value) {
        size_t offset = FindOffset(key);
        if (table[offset].has_value() == false) {
            // Not there already; possibly grow.
            if (3 * ++nStored > capacity()) {
                Grow();
                offset = FindOffset(key);
            }
        }
        table[offset] = std::make_pair(key, value);
    }